

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharpyuv.c
# Opt level: O2

void UpdateW(fixed_y_t *src,fixed_y_t *dst,int w,int rgb_bit_depth,
            SharpYuvTransferFunctionType transfer_type)

{
  uint16_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  int iVar5;
  long lVar6;
  
  iVar5 = 2;
  if (0xc < rgb_bit_depth) {
    iVar5 = 0xe - rgb_bit_depth;
  }
  iVar5 = iVar5 + rgb_bit_depth;
  lVar6 = 0;
  do {
    uVar2 = SharpYuvGammaToLinear(src[lVar6],iVar5,transfer_type);
    uVar3 = SharpYuvGammaToLinear(src[w + lVar6],iVar5,transfer_type);
    uVar4 = SharpYuvGammaToLinear(src[w * 2 + lVar6],iVar5,transfer_type);
    uVar1 = SharpYuvLinearToGamma
                      ((uint32_t)
                       ((ulong)uVar4 * 0x127c + (ulong)uVar3 * 0xb717 + (ulong)uVar2 * 0x366d +
                        0x8000 >> 0x10),iVar5,transfer_type);
    dst[lVar6] = uVar1;
    lVar6 = lVar6 + 1;
  } while (lVar6 < w);
  return;
}

Assistant:

static WEBP_INLINE void UpdateW(const fixed_y_t* src, fixed_y_t* dst, int w,
                                int rgb_bit_depth,
                                SharpYuvTransferFunctionType transfer_type) {
  const int bit_depth = rgb_bit_depth + GetPrecisionShift(rgb_bit_depth);
  int i = 0;
  do {
    const uint32_t R =
        SharpYuvGammaToLinear(src[0 * w + i], bit_depth, transfer_type);
    const uint32_t G =
        SharpYuvGammaToLinear(src[1 * w + i], bit_depth, transfer_type);
    const uint32_t B =
        SharpYuvGammaToLinear(src[2 * w + i], bit_depth, transfer_type);
    const uint32_t Y = RGBToGray(R, G, B);
    dst[i] = (fixed_y_t)SharpYuvLinearToGamma(Y, bit_depth, transfer_type);
  } while (++i < w);
}